

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O1

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  uint uVar1;
  uint uVar2;
  word **ppwVar3;
  Builder result;
  Builder builder;
  Reader assignments;
  BuilderArena *pBVar4;
  int iVar5;
  word **ppwVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  Fault f_2;
  ParserInput parserInput;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> _expression95;
  ThrowingErrorReporter errorReporter;
  ValueTranslator translator;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  Fault f;
  Fault f_1;
  Builder lexedTokens;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  undefined1 local_4a8 [8];
  OrphanBuilder OStack_4a0;
  size_t local_480;
  bool local_478;
  int local_46c;
  Builder local_468;
  Exception *local_450;
  ElementCount local_448;
  short local_444;
  Exception *local_440;
  uint local_438;
  char local_430;
  OrphanBuilder local_428;
  SegmentBuilder *local_408;
  WirePointer *local_400;
  CapTableReader *local_3f8;
  ErrorReporter local_3f0;
  char *local_3e8;
  size_t local_3e0;
  ValueTranslator local_3d8;
  Resolver local_3b8;
  StructReader local_3b0;
  ErrorReporter local_380;
  char *local_378;
  size_t local_370;
  ListReader local_368;
  StructBuilder local_338;
  StructBuilder local_310;
  undefined1 local_2e8 [48];
  MallocMessageBuilder local_2b8;
  CapnpParser local_1c8;
  
  sVar8 = input.content.size_;
  pcVar10 = input.content.ptr;
  local_3f0._vptr_ErrorReporter = (_func_int **)&PTR_addError_007009c0;
  local_3e8 = pcVar10;
  local_3e0 = sVar8;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_2e8 + 0x30),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_468,(MessageBuilder *)(local_2e8 + 0x30));
  local_1c8.orphanage.arena = (BuilderArena *)local_468.builder.segment;
  local_1c8.orphanage.capTable = local_468.builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_310,(PointerBuilder *)&local_1c8,(StructSize)0x10000);
  result._builder.capTable = local_310.capTable;
  result._builder.segment = local_310.segment;
  result._builder.data = local_310.data;
  result._builder.pointers = local_310.pointers;
  result._builder.dataSize = local_310.dataSize;
  result._builder.pointerCount = local_310.pointerCount;
  result._builder._38_2_ = local_310._38_2_;
  input_00.size_ = sVar8 - 1;
  input_00.ptr = pcVar10;
  capnp::compiler::lex(input_00,result,&local_3f0);
  orphanageParam = MessageBuilder::getOrphanage((MessageBuilder *)(local_2e8 + 0x30));
  capnp::compiler::CapnpParser::CapnpParser(&local_1c8,orphanageParam,&local_3f0);
  capnp::_::StructBuilder::asReader(&local_310);
  if (local_444 == 0) {
    local_440._0_4_ = 0x7fffffff;
    local_468.builder.capTable = (CapTableBuilder *)0x0;
    local_450 = (Exception *)0x0;
    local_468.builder.segment = (SegmentBuilder *)0x0;
  }
  OStack_4a0.capTable = (CapTableBuilder *)CONCAT44(OStack_4a0.capTable._4_4_,local_440._0_4_);
  local_4a8 = (undefined1  [8])local_468.builder.segment;
  OStack_4a0.tag.content = (uint64_t)local_468.builder.capTable;
  OStack_4a0.segment = (SegmentBuilder *)local_450;
  capnp::_::PointerReader::getList
            ((ListReader *)local_2e8,(PointerReader *)local_4a8,INLINE_COMPOSITE,(word *)0x0);
  local_468.builder.segment = (SegmentBuilder *)0x0;
  local_468.builder.pointer._0_4_ = 0;
  local_448 = local_2e8._24_4_;
  local_438 = 0;
  local_468.builder.capTable = (CapTableBuilder *)local_2e8;
  local_450 = (Exception *)local_2e8;
  local_440 = (Exception *)local_2e8;
  if (local_2e8._24_4_ == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x6d,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal((Fault *)local_4a8);
  }
  (*(code *)**(undefined8 **)local_1c8.parsers.expression.wrapper)
            ((DebugComparison<capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
              *)local_4a8,local_1c8.parsers.expression.wrapper,local_1c8.parsers.expression.parser);
  local_430 = local_4a8[0];
  if (local_4a8[0] == '\x01') {
    local_428.capTable = OStack_4a0.capTable;
    local_428.location = OStack_4a0.location;
    local_428.tag.content = OStack_4a0.tag.content;
    local_428.segment = OStack_4a0.segment;
    OStack_4a0.segment = (SegmentBuilder *)0x0;
    OStack_4a0.location = (word *)0x0;
  }
  if ((local_4a8[0] != '\0') && ((Exception *)OStack_4a0.segment != (Exception *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&OStack_4a0);
  }
  if (local_430 == '\x01') {
    local_4a8 = (undefined1  [8])local_468.builder.capTable;
    OStack_4a0.tag.content._0_4_ = (uint)local_468.builder.pointer;
    OStack_4a0.capTable = (CapTableBuilder *)CONCAT44(OStack_4a0.capTable._4_4_,local_2e8._24_4_);
    OStack_4a0.location = (word *)0x4fd0ae;
    local_480 = 5;
    local_478 = (uint)local_468.builder.pointer == local_2e8._24_4_;
    OStack_4a0.segment = (SegmentBuilder *)local_2e8;
    if (!local_478) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>&,char_const(&)[23]>
                ((Fault *)&local_368,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x61,FAILED,"parserInput.getPosition() == tokens.end()",
                 "_kjCondition,\"Extra tokens in input.\"",
                 (DebugComparison<capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
                  *)local_4a8,(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal((Fault *)&local_368);
    }
    capnp::_::OrphanBuilder::asStructReader(&local_3b0,&local_428,(StructSize)0x20003);
    if (local_3b0.dataSize < 0x10) {
      local_3d8.resolver = (Resolver *)((ulong)local_3d8.resolver._1_7_ << 8);
    }
    else {
      local_3d8.resolver = (Resolver *)CONCAT71(local_3d8.resolver._1_7_,*local_3b0.data == 7);
      if (*local_3b0.data == 7) {
        local_408 = (SegmentBuilder *)local_3b0.segment;
        local_400 = local_3b0.pointers;
        local_46c = local_3b0.nestingLimit;
        local_3f8 = local_3b0.capTable;
        local_380._vptr_ErrorReporter = (_func_int **)&PTR_addError_007009c0;
        local_3b8._vptr_Resolver = (_func_int **)&PTR_resolveConstant_00700a00;
        local_338.dataSize = output.builder.dataSize;
        local_338.pointerCount = output.builder.pointerCount;
        local_338._38_2_ = output.builder._38_2_;
        local_338.data = output.builder.data;
        local_338.pointers = output.builder.pointers;
        local_338.segment = output.builder.segment;
        local_338.capTable = output.builder.capTable;
        local_378 = pcVar10;
        local_370 = sVar8;
        pBVar4 = capnp::_::StructBuilder::getArena(&local_338);
        local_3d8.orphanage.capTable = capnp::_::StructBuilder::getCapTable(&local_338);
        local_3d8.resolver = &local_3b8;
        local_3d8.errorReporter = &local_380;
        local_4a8 = (undefined1  [8])output.schema.super_Schema.raw;
        OStack_4a0.tag.content = (uint64_t)output.builder.segment;
        OStack_4a0.segment = (SegmentBuilder *)output.builder.capTable;
        OStack_4a0.capTable = (CapTableBuilder *)output.builder.data;
        OStack_4a0.location = (word *)output.builder.pointers;
        local_480._0_4_ = output.builder.dataSize;
        local_480._4_2_ = output.builder.pointerCount;
        local_480._6_2_ = output.builder._38_2_;
        local_338.capTable = (CapTableBuilder *)local_3f8;
        local_338.data = local_400;
        local_338.segment = local_408;
        iVar5 = local_46c;
        if (local_3b0.pointerCount == 0) {
          local_338.capTable = (CapTableBuilder *)(CapTableReader *)0x0;
          local_338.data = (WirePointer *)0x0;
          local_338.segment = (SegmentBuilder *)0x0;
          iVar5 = 0x7fffffff;
        }
        local_338.pointers = (WirePointer *)CONCAT44(local_338.pointers._4_4_,iVar5);
        local_3d8.orphanage.arena = pBVar4;
        capnp::_::PointerReader::getList
                  (&local_368,(PointerReader *)&local_338,INLINE_COMPOSITE,(word *)0x0);
        builder.builder.segment = (SegmentBuilder *)OStack_4a0.tag.content;
        builder.schema.super_Schema.raw = (Schema)(Schema)local_4a8;
        builder.builder.capTable = (CapTableBuilder *)OStack_4a0.segment;
        builder.builder.data = OStack_4a0.capTable;
        builder.builder.pointers = (WirePointer *)OStack_4a0.location;
        builder.builder.dataSize = (undefined4)local_480;
        builder.builder.pointerCount = local_480._4_2_;
        builder.builder._38_2_ = local_480._6_2_;
        assignments.reader.capTable = local_368.capTable;
        assignments.reader.segment = local_368.segment;
        assignments.reader.ptr = local_368.ptr;
        assignments.reader.elementCount = local_368.elementCount;
        assignments.reader.step = local_368.step;
        assignments.reader.structDataSize = local_368.structDataSize;
        assignments.reader.structPointerCount = local_368.structPointerCount;
        assignments.reader.elementSize = local_368.elementSize;
        assignments.reader._39_1_ = local_368._39_1_;
        assignments.reader.nestingLimit = local_368.nestingLimit;
        assignments.reader._44_4_ = local_368._44_4_;
        capnp::compiler::ValueTranslator::fillStructValue(&local_3d8,builder,assignments);
        goto LAB_003be872;
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[33]>
              ((Fault *)&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x88,FAILED,"expression.isTuple()",
               "_kjCondition,\"Input does not contain a struct.\"",
               (DebugExpression<bool> *)&local_3d8,(char (*) [33])"Input does not contain a struct."
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_338);
  }
  else {
    uVar7 = local_438;
    if (local_438 < (uint)local_468.builder.pointer) {
      uVar7 = (uint)local_468.builder.pointer;
    }
    if (uVar7 == local_2e8._24_4_) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_4a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x67,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal((Fault *)local_4a8);
    }
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_4a8,
               *(ListReader **)
                ((long)&local_468 + (ulong)((uint)local_468.builder.pointer <= local_438) * 0x20 + 8
                ),uVar7);
    uVar9 = 0;
    uVar11 = 0;
    if (0x3f < (uint)OStack_4a0.location) {
      uVar11 = (ulong)*(uint *)((long)&((OStack_4a0.segment)->super_SegmentReader).arena + 4);
    }
    if (0x9f < (uint)OStack_4a0.location) {
      uVar9 = (ulong)*(uint *)&((OStack_4a0.segment)->super_SegmentReader).ptr.ptr;
    }
    (**local_3f0._vptr_ErrorReporter)(&local_3f0,uVar11,uVar9,"Parse error",0xc);
  }
LAB_003be872:
  if ((local_430 == '\x01') && ((Exception *)local_428.segment != (Exception *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&local_428);
  }
  if (local_468.builder.segment != (SegmentBuilder *)0x0) {
    uVar7 = local_438;
    ppwVar3 = (word **)&local_440;
    if (local_438 < (uint)local_468.builder.pointer) {
      uVar7 = (uint)local_468.builder.pointer;
      ppwVar3 = (word **)&local_468.builder.capTable;
    }
    uVar1 = *(uint *)&(local_468.builder.segment)->readOnly;
    uVar2 = uVar7;
    if (uVar7 <= uVar1) {
      uVar2 = uVar1;
    }
    ppwVar6 = &(local_468.builder.segment)->pos;
    if (uVar1 < uVar7) {
      ppwVar6 = ppwVar3;
    }
    (local_468.builder.segment)->pos = (word *)*ppwVar6;
    *(uint *)&(local_468.builder.segment)->readOnly = uVar2;
  }
  capnp::compiler::CapnpParser::~CapnpParser(&local_1c8);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_2e8 + 0x30));
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.") { return; }

    ThrowingErrorReporter errorReporter(input);
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}